

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool op_tbranch(DisasContext_conflict1 *s,arg_tbranch *a,_Bool half)

{
  TCGContext_conflict1 *tcg_ctx_00;
  int index;
  uint32_t arg2;
  TCGv_i32 ret;
  TCGv_i32 ret_00;
  MemOp local_5c;
  TCGv_i32 tmp;
  TCGv_i32 addr;
  TCGContext_conflict1 *tcg_ctx;
  _Bool half_local;
  arg_tbranch *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  ret = load_reg(s,a->rm);
  if (half) {
    tcg_gen_add_i32(tcg_ctx_00,ret,ret,ret);
  }
  ret_00 = load_reg(s,a->rn);
  tcg_gen_add_i32(tcg_ctx_00,ret_00,ret_00,ret);
  index = get_mem_index(s);
  if (half) {
    local_5c = s->be_data | MO_16;
  }
  else {
    local_5c = MO_8;
  }
  gen_aa32_ld_i32(s,ret,ret_00,index,local_5c);
  tcg_temp_free_i32(tcg_ctx_00,ret_00);
  tcg_gen_add_i32(tcg_ctx_00,ret,ret,ret);
  arg2 = read_pc(s);
  tcg_gen_addi_i32_aarch64(tcg_ctx_00,ret,ret,arg2);
  store_reg(s,0xf,ret);
  return true;
}

Assistant:

static bool op_tbranch(DisasContext *s, arg_tbranch *a, bool half)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 addr, tmp;

    tmp = load_reg(s, a->rm);
    if (half) {
        tcg_gen_add_i32(tcg_ctx, tmp, tmp, tmp);
    }
    addr = load_reg(s, a->rn);
    tcg_gen_add_i32(tcg_ctx, addr, addr, tmp);

    gen_aa32_ld_i32(s, tmp, addr, get_mem_index(s),
                    half ? MO_UW | s->be_data : MO_UB);
    tcg_temp_free_i32(tcg_ctx, addr);

    tcg_gen_add_i32(tcg_ctx, tmp, tmp, tmp);
    tcg_gen_addi_i32(tcg_ctx, tmp, tmp, read_pc(s));
    store_reg(s, 15, tmp);
    return true;
}